

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int server::clientconnect(int n,uint ip,char *ipstr)

{
  uint uVar1;
  stringformatter local_140;
  char local_138 [8];
  string cm;
  clientinfo *local_28;
  clientinfo *ci;
  char *ipstr_local;
  int local_10;
  uint ip_local;
  int n_local;
  
  ci = (clientinfo *)ipstr;
  ipstr_local._4_4_ = ip;
  local_10 = n;
  local_28 = getinfo(n);
  local_28->ip = (char *)ci;
  stringformatter::stringformatter(&local_140,local_138);
  stringformatter::operator()(&local_140,"IP: %s",local_28->ip);
  if (showclientips != 0) {
    privilegemsg(3,local_138);
  }
  local_28->ownernum = local_10;
  local_28->clientnum = local_10;
  local_28->connectmillis = totalmillis;
  uVar1 = randomMT();
  local_28->sessionid = ((uVar1 & 0xffffff) % 0x1000000) * (totalmillis % 10000 + 1) & 0xffffff;
  vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)connects,&local_28);
  if ((local_28->isSpecLocked & 1U) != 0) {
    forcespectator(local_28);
  }
  if ((local_28->votedmapsucks & 1U) != 0) {
    local_28->votedmapsucks = true;
  }
  if (((gamemode < -3) || (0x16 < gamemode)) || ((gamemodes[gamemode + 3].flags & 0x4000U) != 0)) {
    ip_local = 2;
  }
  else {
    sendservinfo(local_28);
    ip_local = 0;
  }
  return ip_local;
}

Assistant:

int clientconnect(int n, uint ip, char *ipstr)
    {
        clientinfo *ci = getinfo(n);
        ci->ip=ipstr; //QServ ci->ip
        defformatstring(cm)("IP: %s", ci->ip);
        if(showclientips) privilegemsg(PRIV_ADMIN, cm);
        ci->clientnum = ci->ownernum = n;
        ci->connectmillis = totalmillis;
        ci->sessionid = (rnd(0x1000000)*((totalmillis%10000)+1))&0xFFFFFF;
        connects.add(ci);
        if(ci->isSpecLocked) forcespectator(ci);
        if(ci->votedmapsucks) ci->votedmapsucks = true;
        if(!m_mp(gamemode)) return DISC_LOCAL;
        sendservinfo(ci);
        return DISC_NONE;
    }